

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O2

int __thiscall ExtraData::parseCodePageStream(ExtraData *this,TypedPropertyValue *value,int from)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> _Stack_48;
  
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"MUST be a CodePageString.");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"              Value:                ");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"                 CodePageString:    ");
  std::endl<char,std::char_traits<char>>(poVar2);
  __x = &value->Value;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_48,__x);
  iVar1 = Utils::lenFourBytesFromPos
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_48,from);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&_Stack_48);
  poVar2 = std::operator<<((ostream *)&std::cout,"                     Size:          ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2," bytes");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "The size in bytes of the Characters field, including the null terminator, "
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "but not including padding (if any). If the property set\'s CodePage property "
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "has the value CP_WINUNICODE (0x04B0), then the value MUST be a multiple of 2."
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar3 = 0x960;
  if (iVar1 != 0x4b0) {
    iVar3 = iVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"                     Characters:    ");
  std::endl<char,std::char_traits<char>>(poVar2);
  if (0 < iVar3) {
    iVar1 = Utils::getCountOfBytesBeforeNullTerminatorInt
                      ((const_iterator)
                       (__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start);
    Utils::print_vec_unicode_from_to(__x,from + 4,iVar1 + from);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "If Size is nonzero and the CodePage property set\'s CodePage property ")
  ;
  poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "has the value CP_WINUNICODE (0x04B0), then the value MUST be a null-terminated array "
                          );
  poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "of 16-bit Unicode characters, followed by zero padding to a multiple of 4 bytes."
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "If Size is nonzero and the property set\'s CodePage property has any other value, "
                          );
  poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "it MUST be a null-terminated array of 8-bit characters from the code page "
                          );
  poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "identified by the CodePage property, followed by zero padding to a multiple of 4 bytes."
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  return iVar3 + 4;
}

Assistant:

int ExtraData::parseCodePageStream(ExtraData::PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue value, int from) {
    cout << Utils::defaultOffsetDocInfo << "MUST be a CodePageString." << endl;
    cout << "              Value:                " << endl;
    cout << "                 CodePageString:    " << endl;
    int len = Utils::lenFourBytesFromPos(value.Value, from);
    cout << "                     Size:          " << len << " bytes" << endl <<
         Utils::defaultOffsetDocInfo << "The size in bytes of the Characters field, including the null terminator, " << endl <<
         Utils::defaultOffsetDocInfo << "but not including padding (if any). If the property set's CodePage property " << endl <<
         Utils::defaultOffsetDocInfo << "has the value CP_WINUNICODE (0x04B0), then the value MUST be a multiple of 2." << endl;
    if(len == 0x04B0)
        len *= 2;
    cout << "                     Characters:    " << endl;
    if(len > 0) {;
        int posNullTerminator = Utils::getCountOfBytesBeforeNullTerminatorInt(value.Value.begin());
        if(len == 0x04B0) {
            Utils::print_vec_unicode_from_to(value.Value, from + 4, from + posNullTerminator);
        } else {
            Utils::print_vec_unicode_from_to(value.Value, from + 4, from + posNullTerminator);
        }
    }
    cout << Utils::defaultOffsetDocInfo << "If Size is nonzero and the CodePage property set's CodePage property " <<
         Utils::defaultOffsetDocInfo << "has the value CP_WINUNICODE (0x04B0), then the value MUST be a null-terminated array " <<
         Utils::defaultOffsetDocInfo << "of 16-bit Unicode characters, followed by zero padding to a multiple of 4 bytes." << endl <<

         Utils::defaultOffsetDocInfo << "If Size is nonzero and the property set's CodePage property has any other value, " <<
         Utils::defaultOffsetDocInfo << "it MUST be a null-terminated array of 8-bit characters from the code page " <<
         Utils::defaultOffsetDocInfo << "identified by the CodePage property, followed by zero padding to a multiple of 4 bytes." << endl;
    return len + 4;
}